

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O0

void __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ExportObj(ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            *this,int i)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  BasicStringRef<char> value_01;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  uint uVar1;
  Type TVar2;
  int iVar3;
  BasicFileAppender *pBVar4;
  undefined4 extraout_var;
  string *this_00;
  BasicCStringRef<char> arg0;
  ExprBase this_01;
  basic_string_view<char,_std::char_traits<char>_> *this_02;
  VarNamer __str;
  BasicMemoryWriter<char,_std::allocator<char>_> *this_03;
  BasicMemoryWriter<char,_std::allocator<char>_> *s;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  MutObjective MVar6;
  MemoryWriter w2;
  MutObjective obj;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> jw;
  MemoryWriter wrt;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffff9d8;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_fffffffffffff9e0;
  BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *in_stack_fffffffffffff9e8;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffff9f0;
  allocator<char> *in_stack_fffffffffffff9f8;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_fffffffffffffa00;
  char *in_stack_fffffffffffffa08;
  size_t in_stack_fffffffffffffa10;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_fffffffffffffa18;
  size_t in_stack_fffffffffffffa20;
  char *in_stack_fffffffffffffa28;
  char *pcVar7;
  BasicCStringRef<char> local_588 [5];
  BasicMemoryWriter<char,_std::allocator<char>_> *local_560;
  BasicProblem<mp::BasicProblemParams<int>_> *local_558;
  ExprBase local_550;
  LinearExpr *in_stack_fffffffffffffab8;
  Writer *in_stack_fffffffffffffac0;
  VarNamer in_stack_fffffffffffffac8;
  ExprBase in_stack_fffffffffffffad0;
  allocator<char> local_511 [589];
  Type local_2c4;
  BasicProblem<mp::BasicProblemParams<int>_> *local_2c0;
  int local_2b8;
  BasicProblem<mp::BasicProblemParams<int>_> *local_2b0;
  int local_2a8;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_260 [2];
  allocator<char> local_239;
  BasicMemoryWriter<char,_std::allocator<char>_> local_238;
  size_t sVar5;
  undefined4 extraout_var_00;
  
  GetFlatCvt(in_RDI);
  pBVar4 = ConstraintManager::GetFileAppender((ConstraintManager *)0x612847);
  uVar1 = (*(pBVar4->super_BasicLogger)._vptr_BasicLogger[2])();
  if ((uVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
    std::allocator<char>::~allocator(&local_239);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::MiniJSONWriter
              (local_260,&local_238);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9f0,
               (char *)in_stack_fffffffffffff9e8);
    key._M_str = in_stack_fffffffffffffa28;
    key._M_len = in_stack_fffffffffffffa20;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              (in_stack_fffffffffffffa18,key);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              (in_stack_fffffffffffff9e0,(int *)in_stack_fffffffffffff9d8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x612908);
    (*(in_RDI->
      super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
      ).
      super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
      .
      super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
      ._vptr_BasicExprVisitor[0x12])();
    BasicProblem<mp::BasicProblemParams<int>>::obj_name_abi_cxx11_
              (in_stack_fffffffffffff9f0,(int)((ulong)in_stack_fffffffffffff9e8 >> 0x20));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9f0,
               (char *)in_stack_fffffffffffff9e8);
    key_00._M_str = in_stack_fffffffffffffa28;
    key_00._M_len = in_stack_fffffffffffffa20;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              (in_stack_fffffffffffffa18,key_00);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              (in_stack_fffffffffffff9e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9d8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x6129a3);
    (*(in_RDI->
      super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
      ).
      super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
      .
      super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
      ._vptr_BasicExprVisitor[0x12])();
    MVar6 = BasicProblem<mp::BasicProblemParams<int>_>::obj
                      (in_stack_fffffffffffff9f0,(int)((ulong)in_stack_fffffffffffff9e8 >> 0x20));
    local_2c0 = MVar6.
                super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
    local_2b8 = MVar6.
                super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
    local_2b0 = local_2c0;
    local_2a8 = local_2b8;
    local_2c4 = BasicProblem<mp::BasicProblemParams<int>_>::
                BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                ::type((BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                        *)in_stack_fffffffffffff9e0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9f0,
               (char *)in_stack_fffffffffffff9e8);
    key_01._M_str = in_stack_fffffffffffffa28;
    key_01._M_len = in_stack_fffffffffffffa20;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              (in_stack_fffffffffffffa18,key_01);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              (in_stack_fffffffffffff9e0,(int *)in_stack_fffffffffffff9d8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x612a8d);
    std::allocator<char>::allocator();
    fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
    std::allocator<char>::~allocator(local_511);
    TVar2 = BasicProblem<mp::BasicProblemParams<int>_>::
            BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
            ::type((BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                    *)in_stack_fffffffffffff9e0);
    if (TVar2 == MAX) {
      pcVar7 = "maximize ";
    }
    else {
      pcVar7 = "minimize ";
    }
    fmt::BasicStringRef<char>::BasicStringRef
              ((BasicStringRef<char> *)in_stack_fffffffffffff9e0,(char *)in_stack_fffffffffffff9d8);
    value.size_ = in_stack_fffffffffffffa10;
    value.data_ = in_stack_fffffffffffffa08;
    fmt::BasicWriter<char>::operator<<(&in_stack_fffffffffffffa00->super_BasicWriter<char>,value);
    iVar3 = (*(in_RDI->
              super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
              ).
              super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
              .
              super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
              ._vptr_BasicExprVisitor[0x12])();
    sVar5 = CONCAT44(extraout_var,iVar3);
    this_00 = BasicProblem<mp::BasicProblemParams<int>>::obj_name_abi_cxx11_
                        (in_stack_fffffffffffff9f0,(int)((ulong)in_stack_fffffffffffff9e8 >> 0x20));
    fmt::BasicStringRef<char>::BasicStringRef
              ((BasicStringRef<char> *)in_stack_fffffffffffff9e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9d8);
    value_00.size_ = in_stack_fffffffffffffa10;
    value_00.data_ = in_stack_fffffffffffffa08;
    arg0.data_ = (char *)fmt::BasicWriter<char>::operator<<
                                   (&in_stack_fffffffffffffa00->super_BasicWriter<char>,value_00);
    fmt::BasicStringRef<char>::BasicStringRef
              ((BasicStringRef<char> *)in_stack_fffffffffffff9e0,(char *)in_stack_fffffffffffff9d8);
    value_01.size_ = (size_t)arg0.data_;
    value_01.data_ = in_stack_fffffffffffffa08;
    fmt::BasicWriter<char>::operator<<(&in_stack_fffffffffffffa00->super_BasicWriter<char>,value_01)
    ;
    BasicProblem<mp::BasicProblemParams<int>_>::MutObjective::linear_expr((MutObjective *)0x612bde);
    this_01.impl_ =
         (Impl *)BasicProblem<mp::BasicProblemParams<int>_>::
                 BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                 ::nonlinear_expr(in_stack_fffffffffffff9e8);
    local_550.impl_ = this_01.impl_;
    iVar3 = (*(in_RDI->
              super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
              ).
              super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
              .
              super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
              ._vptr_BasicExprVisitor[0x12])();
    this_02 = (basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(extraout_var_00,iVar3);
    __str = BasicProblem<mp::BasicProblemParams<int>_>::GetVarNamer(in_stack_fffffffffffff9d8);
    local_558 = __str.p_;
    WriteExpr<mp::internal::ExprTypes,mp::LinearExpr,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
              (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
               (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_fffffffffffffad0.impl_,
               in_stack_fffffffffffffac8);
    this_03 = (BasicMemoryWriter<char,_std::allocator<char>_> *)
              fmt::BasicWriter<char>::c_str((BasicWriter<char> *)in_stack_fffffffffffff9e0);
    local_560 = this_03;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_02,(char *)__str.p_);
    key_02._M_str = pcVar7;
    key_02._M_len = sVar5;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)this_00,
               key_02);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)this_03,
               (char **)in_stack_fffffffffffff9d8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x612cde);
    fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(this_03);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x612cf8);
    fmt::BasicCStringRef<char>::BasicCStringRef(local_588,"\n");
    fmt::BasicWriter<char>::write<>((BasicWriter<char> *)this_01.impl_,arg0);
    GetFlatCvt(in_RDI);
    s = (BasicMemoryWriter<char,_std::allocator<char>_> *)
        ConstraintManager::GetFileAppender((ConstraintManager *)0x612d3e);
    BasicFileAppender::Append<fmt::BasicMemoryWriter<char,std::allocator<char>>>
              ((BasicFileAppender *)this_03,s);
    fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(this_03);
  }
  return;
}

Assistant:

void ExportObj(int i) {
    if (GetFlatCvt().GetFileAppender().IsOpen()) {
      fmt::MemoryWriter wrt;
      {
        MiniJSONWriter jw(wrt);
        jw["NL_OBJECTIVE_index"] = i;
        jw["name"] = GetModel().obj_name(i);
        auto obj = GetModel().obj(i);
        jw["sense"] = (int)obj.type();
        fmt::MemoryWriter w2;
        w2 << (obj::MAX==obj.type() ? "maximize " : "minimize ");
        w2 << GetModel().obj_name(i) << ": ";
        WriteExpr<typename ProblemType::ExprTypes>(
              w2, obj.linear_expr(), obj.nonlinear_expr(),
              GetModel().GetVarNamer());
        jw["printed"] = w2.c_str();
      }
      wrt.write("\n");                     // EOL
      GetFlatCvt().GetFileAppender().Append(wrt);
    }
  }